

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:345:17)>_>
::dispose(Own<kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:345:17)>_>
          *this)

{
  Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:345:17)>
  *object;
  Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:345:17)>
  *ptrCopy;
  Own<kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:345:17)>_>
  *this_local;
  
  object = this->ptr;
  if (object != (Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:345:17)>
                 *)0x0) {
    this->ptr = (Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:345:17)>
                 *)0x0;
    Disposer::
    dispose<kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client()>::Impl<capnp::_::(anonymous_namespace)::TestCase343::run()::__0>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }